

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::LambdaFunctions::ListLambdaBind
          (LambdaFunctions *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool has_index)

{
  Expression *pEVar1;
  reference this_00;
  pointer this_01;
  BoundLambdaExpression *pBVar2;
  ListLambdaBindData *this_02;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  ListLambdaBindData *local_30;
  
  ListLambdaPrepareBind((LambdaFunctions *)&local_30,arguments,context,bound_function);
  this_02 = local_30;
  if (local_30 == (ListLambdaBindData *)0x0) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](arguments,1);
    this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    pBVar2 = BaseExpression::Cast<duckdb::BoundLambdaExpression>((BaseExpression *)this_01);
    pEVar1 = *(Expression **)(pBVar2 + 0x58);
    *(undefined8 *)(pBVar2 + 0x58) = 0;
    this_02 = (ListLambdaBindData *)operator_new(0x30);
    local_38._M_head_impl = pEVar1;
    ListLambdaBindData::ListLambdaBindData
              (this_02,(LogicalType *)&bound_function->field_0x90,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_38,has_index,false);
    if (local_38._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  *(ListLambdaBindData **)this = this_02;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> LambdaFunctions::ListLambdaBind(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments,
                                                         const bool has_index) {
	unique_ptr<FunctionData> bind_data = ListLambdaPrepareBind(arguments, context, bound_function);
	if (bind_data) {
		return bind_data;
	}

	// get the lambda expression and put it in the bind info
	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	auto lambda_expr = std::move(bound_lambda_expr.lambda_expr);

	return make_uniq<ListLambdaBindData>(bound_function.return_type, std::move(lambda_expr), has_index);
}